

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O3

void __thiscall
DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::
RemoveElement<Memory::NoThrowHeapAllocator>
          (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *this,
          NoThrowHeapAllocator *allocator,PageSegmentBase<Memory::VirtualAllocWrapper> *element)

{
  DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *pDVar1;
  code *pcVar2;
  bool bVar3;
  DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *pDVar4;
  undefined4 *puVar5;
  DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *buffer;
  
  buffer = (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
           (element[-1].decommitPages.data + 4);
  pDVar4 = (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)this;
  do {
    pDVar4 = (pDVar4->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).
             next.node;
    if (pDVar4 == (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)this) break;
  } while (pDVar4 != buffer);
  if (pDVar4 == (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x175,"(HasNode(node))","HasNode(node)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pDVar1 = (buffer->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next
           .base;
  **(Type **)&element[-1].freePageCount = (Type)pDVar1;
  pDVar1->prev = *(anon_union_8_3_7fb8a913_for_prev *)&element[-1].freePageCount;
  Memory::SegmentBase<Memory::VirtualAllocWrapper>::~SegmentBase
            (&element->super_SegmentBase<Memory::VirtualAllocWrapper>);
  Memory::NoThrowHeapAllocator::Free(allocator,buffer,0x98);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveElement(TAllocator * allocator, TData * element)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, node);

        this->DecrementCount();

    }